

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_UuidIndex> *a)

{
  int iVar1;
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ON__INT32 local_38;
  int local_34;
  
  iVar1 = a->m_count;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  _local_38 = CONCAT44(iVar3,in_EAX);
  uVar5 = 1;
  bVar2 = WriteInt32(this,1,&local_34);
  if (bVar2 && 0 < (long)iVar1) {
    lVar4 = 0;
    do {
      bVar2 = WriteUuid(this,(ON_UUID *)((a->m_a->m_id).Data4 + lVar4 + -8));
      if (!bVar2) {
        return false;
      }
      _local_38 = CONCAT44(local_34,*(undefined4 *)((long)(&a->m_a->m_id + 1) + lVar4));
      bVar2 = WriteInt32(this,1,&local_38);
      if ((ulong)(long)iVar1 <= uVar5) {
        return bVar2;
      }
      lVar4 = lVar4 + 0x14;
      uVar5 = uVar5 + 1;
    } while (bVar2);
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_UuidIndex>& a )
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteUuid( a[i].m_id );
    if (rc)
      rc = WriteInt( a[i].m_i );
  }
  return rc;
}